

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlgl.h
# Opt level: O2

void rlDrawRenderBatch(rlRenderBatch *batch)

{
  Matrix *pMVar1;
  GLenum GVar2;
  rlDrawCall *prVar3;
  Matrix left;
  Matrix left_00;
  Matrix right;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  _Bool _Var28;
  int i_2;
  int iVar29;
  ulong uVar30;
  int i_1;
  int iVar31;
  long lVar32;
  int i;
  long lVar33;
  long lVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  Matrix matMVP;
  rl_float16 result_3;
  rl_float16 result_2;
  rl_float16 result_1;
  rl_float16 result;
  Matrix matModelView;
  float fStack_134;
  Matrix matProjection;
  rl_float16 result_4;
  
  if (0 < RLGL.State.vertexCounter) {
    if (RLGL.ExtSupported.vao) {
      (*glad_glBindVertexArray)(batch->vertexBuffer[batch->currentBuffer].vaoId);
    }
    (*glad_glBindBuffer)(0x8892,batch->vertexBuffer[batch->currentBuffer].vboId[0]);
    (*glad_glBufferSubData)
              (0x8892,0,(long)RLGL.State.vertexCounter * 0xc,
               batch->vertexBuffer[batch->currentBuffer].vertices);
    (*glad_glBindBuffer)(0x8892,batch->vertexBuffer[batch->currentBuffer].vboId[1]);
    (*glad_glBufferSubData)
              (0x8892,0,(long)RLGL.State.vertexCounter << 3,
               batch->vertexBuffer[batch->currentBuffer].texcoords);
    (*glad_glBindBuffer)(0x8892,batch->vertexBuffer[batch->currentBuffer].vboId[2]);
    (*glad_glBufferSubData)
              (0x8892,0,(long)RLGL.State.vertexCounter * 0xc,
               batch->vertexBuffer[batch->currentBuffer].normals);
    (*glad_glBindBuffer)(0x8892,batch->vertexBuffer[batch->currentBuffer].vboId[3]);
    (*glad_glBufferSubData)
              (0x8892,0,(long)RLGL.State.vertexCounter << 2,
               batch->vertexBuffer[batch->currentBuffer].colors);
    if (RLGL.ExtSupported.vao == true) {
      (*glad_glBindVertexArray)(0);
    }
  }
  _Var28 = RLGL.State.stereoRender;
  uVar27 = RLGL.State.projection._56_8_;
  uVar26 = RLGL.State.projection._48_8_;
  uVar25 = RLGL.State.projection._40_8_;
  uVar24 = RLGL.State.projection._32_8_;
  uVar23 = RLGL.State.projection._24_8_;
  uVar22 = RLGL.State.projection._16_8_;
  uVar21 = RLGL.State.projection._8_8_;
  uVar20 = RLGL.State.projection._0_8_;
  uVar18 = RLGL.State.modelview._56_8_;
  uVar16 = RLGL.State.modelview._48_8_;
  uVar14 = RLGL.State.modelview._40_8_;
  uVar12 = RLGL.State.modelview._32_8_;
  uVar10 = RLGL.State.modelview._24_8_;
  uVar8 = RLGL.State.modelview._16_8_;
  uVar6 = RLGL.State.modelview._8_8_;
  uVar4 = RLGL.State.modelview._0_8_;
  uVar30 = (ulong)RLGL.State.stereoRender;
  for (lVar32 = 0; lVar32 != uVar30 + 1; lVar32 = lVar32 + 1) {
    if (_Var28 != false) {
      (*glad_glViewport)(((int)lVar32 * RLGL.State.framebufferWidth) / 2,0,
                         RLGL.State.framebufferWidth / 2,RLGL.State.framebufferHeight);
      uVar19 = RLGL.State.modelview._56_8_;
      uVar17 = RLGL.State.modelview._48_8_;
      uVar15 = RLGL.State.modelview._40_8_;
      uVar13 = RLGL.State.modelview._32_8_;
      uVar11 = RLGL.State.modelview._24_8_;
      uVar9 = RLGL.State.modelview._16_8_;
      uVar7 = RLGL.State.modelview._8_8_;
      uVar5 = RLGL.State.modelview._0_8_;
      RLGL.State.modelview.m8 = (float)uVar6;
      RLGL.State.modelview.m12 = SUB84(uVar6,4);
      left.m8 = RLGL.State.modelview.m8;
      left.m12 = RLGL.State.modelview.m12;
      RLGL.State.modelview.m0 = (float)uVar4;
      RLGL.State.modelview.m4 = SUB84(uVar4,4);
      left.m0 = RLGL.State.modelview.m0;
      left.m4 = RLGL.State.modelview.m4;
      RLGL.State.modelview.m1 = (float)uVar8;
      RLGL.State.modelview.m5 = SUB84(uVar8,4);
      left.m1 = RLGL.State.modelview.m1;
      left.m5 = RLGL.State.modelview.m5;
      RLGL.State.modelview.m9 = (float)uVar10;
      RLGL.State.modelview.m13 = SUB84(uVar10,4);
      left.m9 = RLGL.State.modelview.m9;
      left.m13 = RLGL.State.modelview.m13;
      RLGL.State.modelview.m2 = (float)uVar12;
      RLGL.State.modelview.m6 = SUB84(uVar12,4);
      left.m2 = RLGL.State.modelview.m2;
      left.m6 = RLGL.State.modelview.m6;
      RLGL.State.modelview.m10 = (float)uVar14;
      RLGL.State.modelview.m14 = SUB84(uVar14,4);
      left.m10 = RLGL.State.modelview.m10;
      left.m14 = RLGL.State.modelview.m14;
      RLGL.State.modelview.m3 = (float)uVar16;
      RLGL.State.modelview.m7 = SUB84(uVar16,4);
      left.m3 = RLGL.State.modelview.m3;
      left.m7 = RLGL.State.modelview.m7;
      RLGL.State.modelview.m11 = (float)uVar18;
      RLGL.State.modelview.m15 = SUB84(uVar18,4);
      left.m11 = RLGL.State.modelview.m11;
      left.m15 = RLGL.State.modelview.m15;
      RLGL.State.modelview._0_8_ = uVar5;
      RLGL.State.modelview._8_8_ = uVar7;
      RLGL.State.modelview._16_8_ = uVar9;
      RLGL.State.modelview._24_8_ = uVar11;
      RLGL.State.modelview._32_8_ = uVar13;
      RLGL.State.modelview._40_8_ = uVar15;
      RLGL.State.modelview._48_8_ = uVar17;
      RLGL.State.modelview._56_8_ = uVar19;
      rlMatrixMultiply(left,RLGL.State.viewOffsetStereo[lVar32]);
      RLGL.State.modelview.m4 = matMVP.m4;
      RLGL.State.modelview.m0 = matMVP.m0;
      RLGL.State.modelview.m12 = matMVP.m12;
      RLGL.State.modelview.m8 = matMVP.m8;
      RLGL.State.modelview.m5 = matMVP.m5;
      RLGL.State.modelview.m1 = matMVP.m1;
      RLGL.State.modelview.m13 = matMVP.m13;
      RLGL.State.modelview.m9 = matMVP.m9;
      RLGL.State.modelview.m6 = matMVP.m6;
      RLGL.State.modelview.m2 = matMVP.m2;
      RLGL.State.modelview.m14 = matMVP.m14;
      RLGL.State.modelview.m10 = matMVP.m10;
      RLGL.State.modelview.m7 = matMVP.m7;
      RLGL.State.modelview.m3 = matMVP.m3;
      RLGL.State.modelview.m15 = matMVP.m15;
      RLGL.State.modelview.m11 = matMVP.m11;
      pMVar1 = RLGL.State.projectionStereo + lVar32;
      RLGL.State.projection.m0 = pMVar1->m0;
      RLGL.State.projection.m4 = pMVar1->m4;
      pMVar1 = RLGL.State.projectionStereo + lVar32;
      RLGL.State.projection.m8 = pMVar1->m8;
      RLGL.State.projection.m12 = pMVar1->m12;
      pMVar1 = RLGL.State.projectionStereo + lVar32;
      RLGL.State.projection.m1 = pMVar1->m1;
      RLGL.State.projection.m5 = pMVar1->m5;
      pMVar1 = RLGL.State.projectionStereo + lVar32;
      RLGL.State.projection.m9 = pMVar1->m9;
      RLGL.State.projection.m13 = pMVar1->m13;
      pMVar1 = RLGL.State.projectionStereo + lVar32;
      RLGL.State.projection.m2 = pMVar1->m2;
      RLGL.State.projection.m6 = pMVar1->m6;
      pMVar1 = RLGL.State.projectionStereo + lVar32;
      RLGL.State.projection.m10 = pMVar1->m10;
      RLGL.State.projection.m14 = pMVar1->m14;
      pMVar1 = RLGL.State.projectionStereo + lVar32;
      RLGL.State.projection.m3 = pMVar1->m3;
      RLGL.State.projection.m7 = pMVar1->m7;
      pMVar1 = RLGL.State.projectionStereo + lVar32;
      RLGL.State.projection.m11 = pMVar1->m11;
      RLGL.State.projection.m15 = pMVar1->m15;
    }
    if (0 < RLGL.State.vertexCounter) {
      (*glad_glUseProgram)(RLGL.State.currentShaderId);
      left_00.m8 = RLGL.State.modelview.m8;
      left_00.m12 = RLGL.State.modelview.m12;
      left_00.m0 = RLGL.State.modelview.m0;
      left_00.m4 = RLGL.State.modelview.m4;
      left_00.m1 = RLGL.State.modelview.m1;
      left_00.m5 = RLGL.State.modelview.m5;
      left_00.m9 = RLGL.State.modelview.m9;
      left_00.m13 = RLGL.State.modelview.m13;
      left_00.m2 = RLGL.State.modelview.m2;
      left_00.m6 = RLGL.State.modelview.m6;
      left_00.m10 = RLGL.State.modelview.m10;
      left_00.m14 = RLGL.State.modelview.m14;
      left_00.m3 = RLGL.State.modelview.m3;
      left_00.m7 = RLGL.State.modelview.m7;
      left_00.m11 = RLGL.State.modelview.m11;
      left_00.m15 = RLGL.State.modelview.m15;
      right.m8 = RLGL.State.projection.m8;
      right.m12 = RLGL.State.projection.m12;
      right.m0 = RLGL.State.projection.m0;
      right.m4 = RLGL.State.projection.m4;
      right.m1 = RLGL.State.projection.m1;
      right.m5 = RLGL.State.projection.m5;
      right.m9 = RLGL.State.projection.m9;
      right.m13 = RLGL.State.projection.m13;
      right.m2 = RLGL.State.projection.m2;
      right.m6 = RLGL.State.projection.m6;
      right.m10 = RLGL.State.projection.m10;
      right.m14 = RLGL.State.projection.m14;
      right.m3 = RLGL.State.projection.m3;
      right.m7 = RLGL.State.projection.m7;
      right.m11 = RLGL.State.projection.m11;
      right.m15 = RLGL.State.projection.m15;
      rlMatrixMultiply(left_00,right);
      (*glad_glUniformMatrix4fv)(RLGL.State.currentShaderLocs[6],1,'\0',result.v);
      if (RLGL.State.currentShaderLocs[8] != -1) {
        result_1.v[0] = RLGL.State.projection.m0;
        result_1.v[1] = RLGL.State.projection.m1;
        result_1.v[2] = RLGL.State.projection.m2;
        result_1.v[3] = RLGL.State.projection.m3;
        result_1.v[4] = RLGL.State.projection.m4;
        result_1.v[5] = RLGL.State.projection.m5;
        result_1.v[6] = RLGL.State.projection.m6;
        result_1.v[7] = RLGL.State.projection.m7;
        result_1.v[8] = RLGL.State.projection.m8;
        result_1.v[9] = RLGL.State.projection.m9;
        result_1.v[10] = RLGL.State.projection.m10;
        result_1.v[0xb] = RLGL.State.projection.m11;
        result_1.v[0xc] = RLGL.State.projection.m12;
        result_1.v[0xd] = RLGL.State.projection.m13;
        result_1.v[0xe] = RLGL.State.projection.m14;
        result_1.v[0xf] = RLGL.State.projection.m15;
        (*glad_glUniformMatrix4fv)(RLGL.State.currentShaderLocs[8],1,'\0',result_1.v);
      }
      if (RLGL.State.currentShaderLocs[7] != -1) {
        result_2.v[0] = RLGL.State.modelview.m0;
        result_2.v[1] = RLGL.State.modelview.m1;
        result_2.v[2] = RLGL.State.modelview.m2;
        result_2.v[3] = RLGL.State.modelview.m3;
        result_2.v[4] = RLGL.State.modelview.m4;
        result_2.v[5] = RLGL.State.modelview.m5;
        result_2.v[6] = RLGL.State.modelview.m6;
        result_2.v[7] = RLGL.State.modelview.m7;
        result_2.v[8] = RLGL.State.modelview.m8;
        result_2.v[9] = RLGL.State.modelview.m9;
        result_2.v[10] = RLGL.State.modelview.m10;
        result_2.v[0xb] = RLGL.State.modelview.m11;
        result_2.v[0xc] = RLGL.State.modelview.m12;
        result_2.v[0xd] = RLGL.State.modelview.m13;
        result_2.v[0xe] = RLGL.State.modelview.m14;
        result_2.v[0xf] = RLGL.State.modelview.m15;
        (*glad_glUniformMatrix4fv)(RLGL.State.currentShaderLocs[7],1,'\0',result_2.v);
      }
      if (RLGL.State.currentShaderLocs[9] != -1) {
        result_3.v[0] = RLGL.State.transform.m0;
        result_3.v[1] = RLGL.State.transform.m1;
        result_3.v[2] = RLGL.State.transform.m2;
        result_3.v[3] = RLGL.State.transform.m3;
        result_3.v[4] = RLGL.State.transform.m4;
        result_3.v[5] = RLGL.State.transform.m5;
        result_3.v[6] = RLGL.State.transform.m6;
        result_3.v[7] = RLGL.State.transform.m7;
        result_3.v[8] = RLGL.State.transform.m8;
        result_3.v[9] = RLGL.State.transform.m9;
        result_3.v[10] = RLGL.State.transform.m10;
        result_3.v[0xb] = RLGL.State.transform.m11;
        result_3.v[0xc] = RLGL.State.transform.m12;
        result_3.v[0xd] = RLGL.State.transform.m13;
        result_3.v[0xe] = RLGL.State.transform.m14;
        result_3.v[0xf] = RLGL.State.transform.m15;
        (*glad_glUniformMatrix4fv)(RLGL.State.currentShaderLocs[9],1,'\0',result_3.v);
      }
      if (RLGL.State.currentShaderLocs[10] != -1) {
        fStack_134 = -RLGL.State.transform.m4;
        fVar41 = RLGL.State.transform.m6 * RLGL.State.transform.m0 -
                 RLGL.State.transform.m4 * RLGL.State.transform.m2;
        fVar42 = RLGL.State.transform.m5 * RLGL.State.transform.m0 -
                 RLGL.State.transform.m4 * RLGL.State.transform.m1;
        fVar38 = -RLGL.State.transform.m3;
        fVar39 = RLGL.State.transform.m0 * RLGL.State.transform.m7 -
                 RLGL.State.transform.m4 * RLGL.State.transform.m3;
        fVar44 = RLGL.State.transform.m1 * RLGL.State.transform.m7 +
                 fVar38 * RLGL.State.transform.m5;
        fVar46 = RLGL.State.transform.m1 * RLGL.State.transform.m6 +
                 -RLGL.State.transform.m2 * RLGL.State.transform.m5;
        fVar40 = RLGL.State.transform.m2 * RLGL.State.transform.m7 -
                 RLGL.State.transform.m6 * RLGL.State.transform.m3;
        fVar45 = RLGL.State.transform.m14 * RLGL.State.transform.m8 -
                 RLGL.State.transform.m12 * RLGL.State.transform.m10;
        fVar47 = RLGL.State.transform.m13 * RLGL.State.transform.m8 -
                 RLGL.State.transform.m12 * RLGL.State.transform.m9;
        fVar43 = RLGL.State.transform.m8 * RLGL.State.transform.m15 -
                 RLGL.State.transform.m12 * RLGL.State.transform.m11;
        fVar49 = -RLGL.State.transform.m11;
        fVar35 = RLGL.State.transform.m9 * RLGL.State.transform.m15 +
                 fVar49 * RLGL.State.transform.m13;
        fVar36 = RLGL.State.transform.m9 * RLGL.State.transform.m14 +
                 -RLGL.State.transform.m10 * RLGL.State.transform.m13;
        fVar37 = RLGL.State.transform.m10 * RLGL.State.transform.m15 -
                 RLGL.State.transform.m14 * RLGL.State.transform.m11;
        fVar48 = 1.0 / (fVar47 * fVar40 +
                       ((fVar46 * fVar43 + fVar36 * fVar39 + (fVar42 * fVar37 - fVar35 * fVar41)) -
                       fVar44 * fVar45));
        result_4.v[0] =
             (RLGL.State.transform.m7 * fVar36 +
             RLGL.State.transform.m5 * fVar37 + -RLGL.State.transform.m6 * fVar35) * fVar48;
        result_4.v[1] =
             (-RLGL.State.transform.m7 * fVar45 +
             fStack_134 * fVar37 + RLGL.State.transform.m6 * fVar43) * fVar48;
        result_4.v[2] =
             (RLGL.State.transform.m7 * fVar47 +
             RLGL.State.transform.m4 * fVar35 + -RLGL.State.transform.m5 * fVar43) * fVar48;
        result_4.v[3] =
             (-RLGL.State.transform.m6 * fVar47 +
             fStack_134 * fVar36 + RLGL.State.transform.m5 * fVar45) * fVar48;
        result_4.v[4] =
             (fVar38 * fVar36 + -RLGL.State.transform.m1 * fVar37 + RLGL.State.transform.m2 * fVar35
             ) * fVar48;
        result_4.v[5] =
             (RLGL.State.transform.m3 * fVar45 +
             RLGL.State.transform.m0 * fVar37 + -RLGL.State.transform.m2 * fVar43) * fVar48;
        result_4.v[6] =
             (fVar38 * fVar47 + -RLGL.State.transform.m0 * fVar35 + RLGL.State.transform.m1 * fVar43
             ) * fVar48;
        result_4.v[7] =
             (RLGL.State.transform.m2 * fVar47 +
             RLGL.State.transform.m0 * fVar36 + -RLGL.State.transform.m1 * fVar45) * fVar48;
        result_4.v[8] =
             (RLGL.State.transform.m15 * fVar46 +
             RLGL.State.transform.m13 * fVar40 + -RLGL.State.transform.m14 * fVar44) * fVar48;
        result_4.v[9] =
             (-RLGL.State.transform.m15 * fVar41 +
             -RLGL.State.transform.m12 * fVar40 + RLGL.State.transform.m14 * fVar39) * fVar48;
        result_4.v[10] =
             (RLGL.State.transform.m15 * fVar42 +
             RLGL.State.transform.m12 * fVar44 + -RLGL.State.transform.m13 * fVar39) * fVar48;
        result_4.v[0xb] =
             (-RLGL.State.transform.m14 * fVar42 +
             -RLGL.State.transform.m12 * fVar46 + RLGL.State.transform.m13 * fVar41) * fVar48;
        result_4.v[0xc] =
             (fVar49 * fVar46 +
             -RLGL.State.transform.m9 * fVar40 + RLGL.State.transform.m10 * fVar44) * fVar48;
        result_4.v[0xd] =
             (RLGL.State.transform.m11 * fVar41 +
             RLGL.State.transform.m8 * fVar40 + -RLGL.State.transform.m10 * fVar39) * fVar48;
        result_4.v[0xe] =
             (fVar49 * fVar42 + -RLGL.State.transform.m8 * fVar44 + RLGL.State.transform.m9 * fVar39
             ) * fVar48;
        result_4.v[0xf] =
             (RLGL.State.transform.m10 * fVar42 +
             RLGL.State.transform.m8 * fVar46 + -RLGL.State.transform.m9 * fVar41) * fVar48;
        (*glad_glUniformMatrix4fv)(RLGL.State.currentShaderLocs[10],1,'\0',result_4.v);
      }
      if (RLGL.ExtSupported.vao == true) {
        (*glad_glBindVertexArray)(batch->vertexBuffer[batch->currentBuffer].vaoId);
      }
      else {
        (*glad_glBindBuffer)(0x8892,batch->vertexBuffer[batch->currentBuffer].vboId[0]);
        (*glad_glVertexAttribPointer)(*RLGL.State.currentShaderLocs,3,0x1406,'\0',0,(void *)0x0);
        (*glad_glEnableVertexAttribArray)(*RLGL.State.currentShaderLocs);
        (*glad_glBindBuffer)(0x8892,batch->vertexBuffer[batch->currentBuffer].vboId[1]);
        (*glad_glVertexAttribPointer)(RLGL.State.currentShaderLocs[1],2,0x1406,'\0',0,(void *)0x0);
        (*glad_glEnableVertexAttribArray)(RLGL.State.currentShaderLocs[1]);
        (*glad_glBindBuffer)(0x8892,batch->vertexBuffer[batch->currentBuffer].vboId[2]);
        (*glad_glVertexAttribPointer)(RLGL.State.currentShaderLocs[3],3,0x1406,'\0',0,(void *)0x0);
        (*glad_glEnableVertexAttribArray)(RLGL.State.currentShaderLocs[3]);
        (*glad_glBindBuffer)(0x8892,batch->vertexBuffer[batch->currentBuffer].vboId[3]);
        (*glad_glVertexAttribPointer)(RLGL.State.currentShaderLocs[5],4,0x1401,'\x01',0,(void *)0x0)
        ;
        (*glad_glEnableVertexAttribArray)(RLGL.State.currentShaderLocs[5]);
        (*glad_glBindBuffer)(0x8893,batch->vertexBuffer[batch->currentBuffer].vboId[4]);
      }
      (*glad_glUniform4f)(RLGL.State.currentShaderLocs[0xc],1.0,1.0,1.0,1.0);
      (*glad_glUniform1i)(RLGL.State.currentShaderLocs[0xf],0);
      for (lVar33 = 0; lVar33 != 4; lVar33 = lVar33 + 1) {
        if (RLGL.State.activeTextureId[lVar33] != 0) {
          (*glad_glActiveTexture)((int)lVar33 + 0x84c1);
          (*glad_glBindTexture)(0xde1,RLGL.State.activeTextureId[lVar33]);
        }
      }
      (*glad_glActiveTexture)(0x84c0);
      lVar34 = 0;
      iVar31 = 0;
      for (lVar33 = 0; lVar33 < batch->drawCounter; lVar33 = lVar33 + 1) {
        (*glad_glBindTexture)(0xde1,*(GLuint *)((long)&batch->draws->textureId + lVar34));
        prVar3 = batch->draws;
        GVar2 = *(GLenum *)((long)&prVar3->mode + lVar34);
        if ((GVar2 == 4) || (GVar2 == 1)) {
          (*glad_glDrawArrays)(GVar2,iVar31,*(GLsizei *)((long)&prVar3->vertexCount + lVar34));
        }
        else {
          (*glad_glDrawElements)
                    (4,(*(int *)((long)&prVar3->vertexCount + lVar34) / 4) * 6,0x1405,
                     (void *)((long)((iVar31 / 4) * 6) << 2));
        }
        iVar31 = iVar31 + *(int *)((long)&batch->draws->vertexCount + lVar34) +
                 *(int *)((long)&batch->draws->vertexAlignment + lVar34);
        lVar34 = lVar34 + 0x10;
      }
      if (RLGL.ExtSupported.vao == false) {
        (*glad_glBindBuffer)(0x8892,0);
        (*glad_glBindBuffer)(0x8893,0);
      }
      (*glad_glBindTexture)(0xde1,0);
    }
    if (RLGL.ExtSupported.vao == true) {
      (*glad_glBindVertexArray)(0);
    }
    (*glad_glUseProgram)(0);
  }
  if (_Var28 != false) {
    (*glad_glViewport)(0,0,RLGL.State.framebufferWidth,RLGL.State.framebufferHeight);
  }
  RLGL.State.vertexCounter = 0;
  batch->currentDepth = -1.0;
  RLGL.State.modelview._0_8_ = uVar4;
  RLGL.State.modelview._8_8_ = uVar6;
  RLGL.State.modelview._16_8_ = uVar8;
  RLGL.State.modelview._24_8_ = uVar10;
  RLGL.State.modelview._32_8_ = uVar12;
  RLGL.State.modelview._40_8_ = uVar14;
  RLGL.State.modelview._48_8_ = uVar16;
  RLGL.State.modelview._56_8_ = uVar18;
  RLGL.State.projection._0_8_ = uVar20;
  RLGL.State.projection._8_8_ = uVar21;
  RLGL.State.projection._16_8_ = uVar22;
  RLGL.State.projection._24_8_ = uVar23;
  RLGL.State.projection._32_8_ = uVar24;
  RLGL.State.projection._40_8_ = uVar25;
  RLGL.State.projection._48_8_ = uVar26;
  RLGL.State.projection._56_8_ = uVar27;
  for (lVar32 = 0; lVar32 != 0x1000; lVar32 = lVar32 + 0x10) {
    *(undefined4 *)((long)&batch->draws->mode + lVar32) = 7;
    *(undefined4 *)((long)&batch->draws->vertexCount + lVar32) = 0;
    *(uint *)((long)&batch->draws->textureId + lVar32) = RLGL.State.defaultTextureId;
  }
  for (lVar32 = 0; lVar32 != 4; lVar32 = lVar32 + 1) {
    RLGL.State.activeTextureId[lVar32] = 0;
  }
  batch->drawCounter = 1;
  iVar29 = batch->currentBuffer + 1;
  iVar31 = 0;
  if (iVar29 < batch->bufferCount) {
    iVar31 = iVar29;
  }
  batch->currentBuffer = iVar31;
  return;
}

Assistant:

void rlDrawRenderBatch(rlRenderBatch *batch)
{
#if defined(GRAPHICS_API_OPENGL_33) || defined(GRAPHICS_API_OPENGL_ES2)
    // Update batch vertex buffers
    //------------------------------------------------------------------------------------------------------------
    // NOTE: If there is not vertex data, buffers doesn't need to be updated (vertexCount > 0)
    // TODO: If no data changed on the CPU arrays --> No need to re-update GPU arrays (use a change detector flag?)
    if (RLGL.State.vertexCounter > 0)
    {
        // Activate elements VAO
        if (RLGL.ExtSupported.vao) glBindVertexArray(batch->vertexBuffer[batch->currentBuffer].vaoId);

        // Vertex positions buffer
        glBindBuffer(GL_ARRAY_BUFFER, batch->vertexBuffer[batch->currentBuffer].vboId[0]);
        glBufferSubData(GL_ARRAY_BUFFER, 0, RLGL.State.vertexCounter*3*sizeof(float), batch->vertexBuffer[batch->currentBuffer].vertices);
        //glBufferData(GL_ARRAY_BUFFER, sizeof(float)*3*4*batch->vertexBuffer[batch->currentBuffer].elementCount, batch->vertexBuffer[batch->currentBuffer].vertices, GL_DYNAMIC_DRAW);  // Update all buffer

        // Texture coordinates buffer
        glBindBuffer(GL_ARRAY_BUFFER, batch->vertexBuffer[batch->currentBuffer].vboId[1]);
        glBufferSubData(GL_ARRAY_BUFFER, 0, RLGL.State.vertexCounter*2*sizeof(float), batch->vertexBuffer[batch->currentBuffer].texcoords);
        //glBufferData(GL_ARRAY_BUFFER, sizeof(float)*2*4*batch->vertexBuffer[batch->currentBuffer].elementCount, batch->vertexBuffer[batch->currentBuffer].texcoords, GL_DYNAMIC_DRAW); // Update all buffer

        // Normals buffer
        glBindBuffer(GL_ARRAY_BUFFER, batch->vertexBuffer[batch->currentBuffer].vboId[2]);
        glBufferSubData(GL_ARRAY_BUFFER, 0, RLGL.State.vertexCounter*3*sizeof(float), batch->vertexBuffer[batch->currentBuffer].normals);
        //glBufferData(GL_ARRAY_BUFFER, sizeof(float)*3*4*batch->vertexBuffer[batch->currentBuffer].elementCount, batch->vertexBuffer[batch->currentBuffer].normals, GL_DYNAMIC_DRAW); // Update all buffer

        // Colors buffer
        glBindBuffer(GL_ARRAY_BUFFER, batch->vertexBuffer[batch->currentBuffer].vboId[3]);
        glBufferSubData(GL_ARRAY_BUFFER, 0, RLGL.State.vertexCounter*4*sizeof(unsigned char), batch->vertexBuffer[batch->currentBuffer].colors);
        //glBufferData(GL_ARRAY_BUFFER, sizeof(float)*4*4*batch->vertexBuffer[batch->currentBuffer].elementCount, batch->vertexBuffer[batch->currentBuffer].colors, GL_DYNAMIC_DRAW);    // Update all buffer

        // NOTE: glMapBuffer() causes sync issue
        // If GPU is working with this buffer, glMapBuffer() will wait(stall) until GPU to finish its job
        // To avoid waiting (idle), you can call first glBufferData() with NULL pointer before glMapBuffer()
        // If you do that, the previous data in PBO will be discarded and glMapBuffer() returns a new
        // allocated pointer immediately even if GPU is still working with the previous data

        // Another option: map the buffer object into client's memory
        // Probably this code could be moved somewhere else...
        // batch->vertexBuffer[batch->currentBuffer].vertices = (float *)glMapBuffer(GL_ARRAY_BUFFER, GL_READ_WRITE);
        // if (batch->vertexBuffer[batch->currentBuffer].vertices)
        // {
            // Update vertex data
        // }
        // glUnmapBuffer(GL_ARRAY_BUFFER);

        // Unbind the current VAO
        if (RLGL.ExtSupported.vao) glBindVertexArray(0);
    }
    //------------------------------------------------------------------------------------------------------------

    // Draw batch vertex buffers (considering VR stereo if required)
    //------------------------------------------------------------------------------------------------------------
    Matrix matProjection = RLGL.State.projection;
    Matrix matModelView = RLGL.State.modelview;

    int eyeCount = 1;
    if (RLGL.State.stereoRender) eyeCount = 2;

    for (int eye = 0; eye < eyeCount; eye++)
    {
        if (eyeCount == 2)
        {
            // Setup current eye viewport (half screen width)
            rlViewport(eye*RLGL.State.framebufferWidth/2, 0, RLGL.State.framebufferWidth/2, RLGL.State.framebufferHeight);

            // Set current eye view offset to modelview matrix
            rlSetMatrixModelview(rlMatrixMultiply(matModelView, RLGL.State.viewOffsetStereo[eye]));
            // Set current eye projection matrix
            rlSetMatrixProjection(RLGL.State.projectionStereo[eye]);
        }

        // Draw buffers
        if (RLGL.State.vertexCounter > 0)
        {
            // Set current shader and upload current MVP matrix
            glUseProgram(RLGL.State.currentShaderId);

            // Create modelview-projection matrix and upload to shader
            Matrix matMVP = rlMatrixMultiply(RLGL.State.modelview, RLGL.State.projection);
            glUniformMatrix4fv(RLGL.State.currentShaderLocs[RL_SHADER_LOC_MATRIX_MVP], 1, false, rlMatrixToFloat(matMVP));

            if (RLGL.State.currentShaderLocs[RL_SHADER_LOC_MATRIX_PROJECTION] != -1)
            {
                glUniformMatrix4fv(RLGL.State.currentShaderLocs[RL_SHADER_LOC_MATRIX_PROJECTION], 1, false, rlMatrixToFloat(RLGL.State.projection));
            }

            // WARNING: For the following setup of the view, model, and normal matrices, it is expected that
            // transformations and rendering occur between rlPushMatrix() and rlPopMatrix()

            if (RLGL.State.currentShaderLocs[RL_SHADER_LOC_MATRIX_VIEW] != -1)
            {
                glUniformMatrix4fv(RLGL.State.currentShaderLocs[RL_SHADER_LOC_MATRIX_VIEW], 1, false, rlMatrixToFloat(RLGL.State.modelview));
            }

            if (RLGL.State.currentShaderLocs[RL_SHADER_LOC_MATRIX_MODEL] != -1)
            {
                glUniformMatrix4fv(RLGL.State.currentShaderLocs[RL_SHADER_LOC_MATRIX_MODEL], 1, false, rlMatrixToFloat(RLGL.State.transform));
            }

            if (RLGL.State.currentShaderLocs[RL_SHADER_LOC_MATRIX_NORMAL] != -1)
            {
                glUniformMatrix4fv(RLGL.State.currentShaderLocs[RL_SHADER_LOC_MATRIX_NORMAL], 1, false, rlMatrixToFloat(rlMatrixTranspose(rlMatrixInvert(RLGL.State.transform))));
            }

            if (RLGL.ExtSupported.vao) glBindVertexArray(batch->vertexBuffer[batch->currentBuffer].vaoId);
            else
            {
                // Bind vertex attrib: position (shader-location = 0)
                glBindBuffer(GL_ARRAY_BUFFER, batch->vertexBuffer[batch->currentBuffer].vboId[0]);
                glVertexAttribPointer(RLGL.State.currentShaderLocs[RL_SHADER_LOC_VERTEX_POSITION], 3, GL_FLOAT, 0, 0, 0);
                glEnableVertexAttribArray(RLGL.State.currentShaderLocs[RL_SHADER_LOC_VERTEX_POSITION]);

                // Bind vertex attrib: texcoord (shader-location = 1)
                glBindBuffer(GL_ARRAY_BUFFER, batch->vertexBuffer[batch->currentBuffer].vboId[1]);
                glVertexAttribPointer(RLGL.State.currentShaderLocs[RL_SHADER_LOC_VERTEX_TEXCOORD01], 2, GL_FLOAT, 0, 0, 0);
                glEnableVertexAttribArray(RLGL.State.currentShaderLocs[RL_SHADER_LOC_VERTEX_TEXCOORD01]);

                // Bind vertex attrib: normal (shader-location = 2)
                glBindBuffer(GL_ARRAY_BUFFER, batch->vertexBuffer[batch->currentBuffer].vboId[2]);
                glVertexAttribPointer(RLGL.State.currentShaderLocs[RL_SHADER_LOC_VERTEX_NORMAL], 3, GL_FLOAT, 0, 0, 0);
                glEnableVertexAttribArray(RLGL.State.currentShaderLocs[RL_SHADER_LOC_VERTEX_NORMAL]);

                // Bind vertex attrib: color (shader-location = 3)
                glBindBuffer(GL_ARRAY_BUFFER, batch->vertexBuffer[batch->currentBuffer].vboId[3]);
                glVertexAttribPointer(RLGL.State.currentShaderLocs[RL_SHADER_LOC_VERTEX_COLOR], 4, GL_UNSIGNED_BYTE, GL_TRUE, 0, 0);
                glEnableVertexAttribArray(RLGL.State.currentShaderLocs[RL_SHADER_LOC_VERTEX_COLOR]);

                glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, batch->vertexBuffer[batch->currentBuffer].vboId[4]);
            }

            // Setup some default shader values
            glUniform4f(RLGL.State.currentShaderLocs[RL_SHADER_LOC_COLOR_DIFFUSE], 1.0f, 1.0f, 1.0f, 1.0f);
            glUniform1i(RLGL.State.currentShaderLocs[RL_SHADER_LOC_MAP_DIFFUSE], 0);  // Active default sampler2D: texture0

            // Activate additional sampler textures
            // Those additional textures will be common for all draw calls of the batch
            for (int i = 0; i < RL_DEFAULT_BATCH_MAX_TEXTURE_UNITS; i++)
            {
                if (RLGL.State.activeTextureId[i] > 0)
                {
                    glActiveTexture(GL_TEXTURE0 + 1 + i);
                    glBindTexture(GL_TEXTURE_2D, RLGL.State.activeTextureId[i]);
                }
            }

            // Activate default sampler2D texture0 (one texture is always active for default batch shader)
            // NOTE: Batch system accumulates calls by texture0 changes, additional textures are enabled for all the draw calls
            glActiveTexture(GL_TEXTURE0);

            for (int i = 0, vertexOffset = 0; i < batch->drawCounter; i++)
            {
                // Bind current draw call texture, activated as GL_TEXTURE0 and Bound to sampler2D texture0 by default
                glBindTexture(GL_TEXTURE_2D, batch->draws[i].textureId);

                if ((batch->draws[i].mode == RL_LINES) || (batch->draws[i].mode == RL_TRIANGLES)) glDrawArrays(batch->draws[i].mode, vertexOffset, batch->draws[i].vertexCount);
                else
                {
    #if defined(GRAPHICS_API_OPENGL_33)
                    // We need to define the number of indices to be processed: elementCount*6
                    // NOTE: The final parameter tells the GPU the offset in bytes from the
                    // start of the index buffer to the location of the first index to process
                    glDrawElements(GL_TRIANGLES, batch->draws[i].vertexCount/4*6, GL_UNSIGNED_INT, (GLvoid *)(vertexOffset/4*6*sizeof(GLuint)));
    #endif
    #if defined(GRAPHICS_API_OPENGL_ES2)
                    glDrawElements(GL_TRIANGLES, batch->draws[i].vertexCount/4*6, GL_UNSIGNED_SHORT, (GLvoid *)(vertexOffset/4*6*sizeof(GLushort)));
    #endif
                }

                vertexOffset += (batch->draws[i].vertexCount + batch->draws[i].vertexAlignment);
            }

            if (!RLGL.ExtSupported.vao)
            {
                glBindBuffer(GL_ARRAY_BUFFER, 0);
                glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, 0);
            }

            glBindTexture(GL_TEXTURE_2D, 0);    // Unbind textures
        }

        if (RLGL.ExtSupported.vao) glBindVertexArray(0); // Unbind VAO

        glUseProgram(0);    // Unbind shader program
    }

    // Restore viewport to default measures
    if (eyeCount == 2) rlViewport(0, 0, RLGL.State.framebufferWidth, RLGL.State.framebufferHeight);
    //------------------------------------------------------------------------------------------------------------

    // Reset batch buffers
    //------------------------------------------------------------------------------------------------------------
    // Reset vertex counter for next frame
    RLGL.State.vertexCounter = 0;

    // Reset depth for next draw
    batch->currentDepth = -1.0f;

    // Restore projection/modelview matrices
    RLGL.State.projection = matProjection;
    RLGL.State.modelview = matModelView;

    // Reset RLGL.currentBatch->draws array
    for (int i = 0; i < RL_DEFAULT_BATCH_DRAWCALLS; i++)
    {
        batch->draws[i].mode = RL_QUADS;
        batch->draws[i].vertexCount = 0;
        batch->draws[i].textureId = RLGL.State.defaultTextureId;
    }

    // Reset active texture units for next batch
    for (int i = 0; i < RL_DEFAULT_BATCH_MAX_TEXTURE_UNITS; i++) RLGL.State.activeTextureId[i] = 0;

    // Reset draws counter to one draw for the batch
    batch->drawCounter = 1;
    //------------------------------------------------------------------------------------------------------------

    // Change to next buffer in the list (in case of multi-buffering)
    batch->currentBuffer++;
    if (batch->currentBuffer >= batch->bufferCount) batch->currentBuffer = 0;
#endif
}